

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O0

void dmlc::serializer::NativePODStringHandler<char>::Write
               (Stream *strm,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *vec)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  unsigned_long local_20;
  uint64_t sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *vec_local;
  Stream *strm_local;
  
  sz = (uint64_t)vec;
  vec_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strm;
  local_20 = std::__cxx11::string::length();
  Stream::Write<unsigned_long>((Stream *)vec_local,&local_20);
  pbVar1 = vec_local;
  if (local_20 != 0) {
    uVar2 = std::__cxx11::string::operator[](sz);
    uVar3 = std::__cxx11::string::length();
    (**(code **)(*(long *)pbVar1 + 8))(pbVar1,uVar2,uVar3);
  }
  return;
}

Assistant:

inline static void Write(Stream *strm, const std::basic_string<T> &vec) {
    uint64_t sz = static_cast<uint64_t>(vec.length());
    strm->Write<uint64_t>(sz);
    if (sz != 0) {
      strm->Write(&vec[0], sizeof(T) * vec.length());
    }
  }